

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O0

void __thiscall
wasm::PrintExpressionContents::printAtomicRMWOp(PrintExpressionContents *this,AtomicRMWOp op)

{
  AtomicRMWOp op_local;
  PrintExpressionContents *this_local;
  
  switch(op) {
  case RMWAdd:
    std::operator<<(this->o,"add");
    break;
  case RMWSub:
    std::operator<<(this->o,"sub");
    break;
  case RMWAnd:
    std::operator<<(this->o,"and");
    break;
  case RMWOr:
    std::operator<<(this->o,"or");
    break;
  case RMWXor:
    std::operator<<(this->o,"xor");
    break;
  case RMWXchg:
    std::operator<<(this->o,"xchg");
    break;
  default:
    handle_unreachable("unexpected rmw op",
                       "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Print.cpp"
                       ,0x2b7);
  }
  return;
}

Assistant:

void printAtomicRMWOp(AtomicRMWOp op) {
    switch (op) {
      case RMWAdd:
        o << "add";
        return;
      case RMWSub:
        o << "sub";
        return;
      case RMWAnd:
        o << "and";
        return;
      case RMWOr:
        o << "or";
        return;
      case RMWXor:
        o << "xor";
        return;
      case RMWXchg:
        o << "xchg";
        return;
    }
    WASM_UNREACHABLE("unexpected rmw op");
  }